

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Lexer::ParseComment(Lexer *this)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  
  sVar3 = GetUtf8CharSize(this->m_current);
  pcVar1 = this->m_current;
  pcVar5 = pcVar1 + sVar3;
  this->m_current = pcVar5;
  this->m_columnNumber = this->m_columnNumber + 1;
  if (((pcVar1[sVar3] == '\0') || (this->m_end < pcVar5)) || (pcVar5[1] != '-')) {
    pcVar5 = this->m_current;
    cVar2 = *pcVar5;
    if ((cVar2 != '\0') && (pcVar5 <= this->m_end)) {
      do {
        if ((cVar2 == '\r') || (cVar2 == '\n')) {
          ParseEndOfLine(this);
          return;
        }
        sVar3 = GetUtf8CharSize(pcVar5);
        pcVar1 = this->m_current;
        pcVar5 = pcVar1 + sVar3;
        this->m_current = pcVar5;
        this->m_columnNumber = this->m_columnNumber + 1;
        cVar2 = pcVar1[sVar3];
      } while ((cVar2 != '\0') && (pcVar5 <= this->m_end));
    }
    return;
  }
  do {
    sVar3 = GetUtf8CharSize(pcVar5);
    pcVar1 = this->m_current;
    pcVar5 = pcVar1 + sVar3;
    this->m_current = pcVar5;
    this->m_columnNumber = this->m_columnNumber + 1;
    if (pcVar1[sVar3] != '-') break;
  } while (pcVar5 <= this->m_end);
  do {
    if ((*this->m_current == '\0') || (this->m_end < this->m_current)) {
      Error<>(this,"Mismatched block comments");
      return;
    }
    pcVar5 = this->m_current;
    cVar2 = *pcVar5;
    bVar6 = true;
    if ((cVar2 == '-') && (pcVar5 <= this->m_end)) {
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        sVar3 = GetUtf8CharSize(pcVar5);
        pcVar1 = this->m_current;
        pcVar5 = pcVar1 + sVar3;
        this->m_current = pcVar5;
        this->m_columnNumber = this->m_columnNumber + 1;
        cVar2 = pcVar1[sVar3];
        if (cVar2 != '-') break;
      } while (pcVar5 <= this->m_end);
      bVar6 = uVar4 < 3;
    }
    if (!bVar6) {
      return;
    }
    if ((cVar2 == '\r') || (cVar2 == '\n')) {
      ParseEndOfLine(this);
    }
    else {
      sVar3 = GetUtf8CharSize(pcVar5);
      this->m_current = this->m_current + sVar3;
      this->m_columnNumber = this->m_columnNumber + 1;
    }
  } while( true );
}

Assistant:

inline_t void Lexer::ParseComment()
	{
		AdvanceCurrent();
		bool blockComment = IsNextCharacter('-');

		// This is a block comment
		if (blockComment)
		{
			AdvanceCurrent();

			// Advance until the end of the line or until we stop seeing dashes
			while (!IsEndOfText())
			{
				if (*m_current != '-')
					break;
				AdvanceCurrent();
			}

			// Find minimum run of three dashes to closed block comment
			while (!IsEndOfText())
			{
				uint32_t dashCount = 0;
				while (!IsEndOfText() && *m_current == '-')
				{
					dashCount++;
					AdvanceCurrent();
				}
				if (dashCount >= 3)
					return;
				else if (IsNewline(*m_current))
					ParseEndOfLine();
				else
					AdvanceCurrent();
			}
			Error("Mismatched block comments");
		}
		// This is a single line comment
		else
		{
			// Advance until the end of the line, then return
			while (!IsEndOfText())
			{
				if (IsNewline(*m_current))
				{
					ParseEndOfLine();
					return;
				}
				AdvanceCurrent();
			}
		}
	}